

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O1

void lysc_ident_free(lysf_ctx *ctx,lysc_ident *ident)

{
  lysc_ext_instance *plVar1;
  void *pvVar2;
  void *pvVar3;
  long lVar4;
  
  lydict_remove(ctx->ctx,ident->name);
  lydict_remove(ctx->ctx,ident->dsc);
  lydict_remove(ctx->ctx,ident->ref);
  if (ident->derived != (lysc_ident **)0x0) {
    free(ident->derived + -1);
  }
  lVar4 = 0;
  pvVar3 = (void *)0x0;
  while( true ) {
    plVar1 = ident->exts;
    if (plVar1 == (lysc_ext_instance *)0x0) {
      pvVar2 = (void *)0x0;
    }
    else {
      pvVar2 = plVar1[-1].compiled;
    }
    if (pvVar2 <= pvVar3) break;
    lysc_ext_instance_free(ctx,(lysc_ext_instance *)((long)&plVar1->def + lVar4));
    pvVar3 = (void *)((long)pvVar3 + 1);
    lVar4 = lVar4 + 0x48;
  }
  if (plVar1 != (lysc_ext_instance *)0x0) {
    free(&plVar1[-1].compiled);
    return;
  }
  return;
}

Assistant:

static void
lysc_ident_free(struct lysf_ctx *ctx, struct lysc_ident *ident)
{
    lydict_remove(ctx->ctx, ident->name);
    lydict_remove(ctx->ctx, ident->dsc);
    lydict_remove(ctx->ctx, ident->ref);
    LY_ARRAY_FREE(ident->derived);
    FREE_ARRAY(ctx, ident->exts, lysc_ext_instance_free);
}